

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.h
# Opt level: O0

CharGroup_ * __thiscall
kj::parse::CharGroup_::orAny(CharGroup_ *__return_storage_ptr__,CharGroup_ *this,char *chars)

{
  CharGroup_ local_38;
  char *local_18;
  char *chars_local;
  CharGroup_ *this_local;
  
  if (*chars == '\0') {
    __return_storage_ptr__->bits[0] = this->bits[0];
    __return_storage_ptr__->bits[1] = this->bits[1];
    __return_storage_ptr__->bits[2] = this->bits[2];
    __return_storage_ptr__->bits[3] = this->bits[3];
  }
  else {
    local_18 = chars;
    chars_local = (char *)this;
    orChar(&local_38,this,*chars);
    orAny(__return_storage_ptr__,&local_38,local_18 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr inline CharGroup_ orAny(const char* chars) const {
    return *chars == 0 ? *this : orChar(*chars).orAny(chars + 1);
  }